

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

bool density_tests::detail::
     PutUInt16<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *param_2)

{
  short *psVar1;
  put_transaction<unsigned_short> put;
  unsigned_short local_62;
  put_transaction<unsigned_short> local_60;
  put_transaction<unsigned_short> local_38;
  
  local_62 = 0xf;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<unsigned_short,unsigned_short>
            (&local_38,
             (conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             queue,&local_62);
  local_60.m_lock._M_device = local_38.m_lock._M_device;
  local_60.m_lock._M_owns = local_38.m_lock._M_owns;
  local_38.m_lock._M_device = (mutex_type *)0x0;
  local_38.m_lock._M_owns = false;
  local_60.m_put_transaction.m_queue = local_38.m_put_transaction.m_queue;
  local_60.m_put_transaction.m_put_data.m_control_block =
       local_38.m_put_transaction.m_put_data.m_control_block;
  local_60.m_put_transaction.m_put_data.m_user_storage =
       local_38.m_put_transaction.m_put_data.m_user_storage;
  local_38.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::~put_transaction(&local_38);
  psVar1 = (short *)density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::put_transaction<unsigned_short>::element_ptr(&local_60.m_put_transaction);
  *psVar1 = *psVar1 + 1;
  exception_checkpoint();
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::commit(&local_60);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::~put_transaction(&local_60);
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom &)
            {
                auto put = queue.template start_emplace<uint16_t>(static_cast<uint16_t>(15));
                put.element() += 1;
                exception_checkpoint();
                put.commit(); // commit a 16. From now on, the element can be consumed
                return true;
            }